

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,bool,duckdb::BinarySingleArgumentOperatorWrapper,duckdb::Equals,bool,false,false>
               (uhugeint_t *ldata,uhugeint_t *rdata,bool *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  idx_t iVar10;
  ulong uVar11;
  uhugeint_t local_68;
  uhugeint_t local_58;
  ulong local_48;
  ulong local_40;
  ValidityMask *local_38;
  
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      lVar4 = 0;
      iVar10 = 0;
      do {
        puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
        local_58.lower = *puVar1;
        local_58.upper = puVar1[1];
        puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
        local_68.lower = *puVar1;
        local_68.upper = puVar1[1];
        bVar3 = uhugeint_t::operator==(&local_58,&local_68);
        result_data[iVar10] = bVar3;
        iVar10 = iVar10 + 1;
        lVar4 = lVar4 + 0x10;
      } while (count != iVar10);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar5 = 0;
    uVar8 = 0;
    local_40 = count;
    do {
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar2[uVar5];
      }
      uVar11 = uVar8 + 0x40;
      if (local_40 <= uVar8 + 0x40) {
        uVar11 = local_40;
      }
      uVar7 = uVar11;
      if (uVar9 != 0) {
        uVar7 = uVar8;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar8 < uVar11) {
            lVar4 = uVar8 << 4;
            do {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
              local_58.lower = *puVar1;
              local_58.upper = puVar1[1];
              puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
              local_68.lower = *puVar1;
              local_68.upper = puVar1[1];
              bVar3 = uhugeint_t::operator==(&local_58,&local_68);
              result_data[uVar7] = bVar3;
              uVar7 = uVar7 + 1;
              lVar4 = lVar4 + 0x10;
            } while (uVar11 != uVar7);
          }
        }
        else if (uVar8 < uVar11) {
          lVar4 = uVar8 << 4;
          uVar6 = 0;
          do {
            if ((uVar9 >> (uVar6 & 0x3f) & 1) != 0) {
              puVar1 = (uint64_t *)((long)&ldata->lower + lVar4);
              local_58.lower = *puVar1;
              local_58.upper = puVar1[1];
              puVar1 = (uint64_t *)((long)&rdata->lower + lVar4);
              local_68.lower = *puVar1;
              local_68.upper = puVar1[1];
              bVar3 = uhugeint_t::operator==(&local_58,&local_68);
              result_data[uVar8] = bVar3;
            }
            uVar8 = uVar8 + 1;
            lVar4 = lVar4 + 0x10;
            uVar6 = uVar6 + 1;
            uVar7 = uVar8;
          } while (uVar11 != uVar8);
        }
      }
      uVar5 = uVar5 + 1;
      uVar8 = uVar7;
    } while (uVar5 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}